

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

PointerReader * __thiscall
capnp::anon_unknown_0::MembraneCapTableReader::imbue
          (PointerReader *__return_storage_ptr__,MembraneCapTableReader *this,PointerReader reader)

{
  CapTableReader *pCVar1;
  Fault local_18;
  Fault f;
  MembraneCapTableReader *this_local;
  
  f.exception = (Exception *)this;
  if (this->inner == (CapTableReader *)0x0) {
    pCVar1 = capnp::_::PointerReader::getCapTable(&reader);
    this->inner = pCVar1;
    capnp::_::PointerReader::imbue(__return_storage_ptr__,&reader,&this->super_CapTableReader);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x2d,FAILED,"inner == nullptr","\"can only call this once\"",
             (char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

_::PointerReader imbue(_::PointerReader reader) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    inner = reader.getCapTable();
    return reader.imbue(this);
  }